

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::SeparationPart::operator==(SeparationPart *this,SeparationPart *Value)

{
  KBOOL KVar1;
  
  if ((this->super_VariableParameter).m_ui8VarParamType !=
      (Value->super_VariableParameter).m_ui8VarParamType) {
    return false;
  }
  if (((this->m_ui8Reason == Value->m_ui8Reason) &&
      (this->m_ui8PreEntIndicator == Value->m_ui8PreEntIndicator)) &&
     (KVar1 = EntityIdentifier::operator!=(&this->m_ParentEntId,&Value->m_ParentEntId), !KVar1)) {
    KVar1 = NamedLocationIdentifier::operator!=(&this->m_StationLoc,&Value->m_StationLoc);
    return !KVar1;
  }
  return false;
}

Assistant:

KBOOL SeparationPart::operator == ( const SeparationPart & Value ) const
{
    if ( m_ui8VarParamType != Value.m_ui8VarParamType)        return false;
    if ( m_ui8Reason != Value.m_ui8Reason )                   return false;
    if ( m_ui8PreEntIndicator != Value.m_ui8PreEntIndicator ) return false;
    if ( m_ParentEntId != Value.m_ParentEntId )               return false;
    if ( m_StationLoc != Value.m_StationLoc )                 return false;
    return true;
}